

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locator.cpp
# Opt level: O0

string * __thiscall DSDcc::Locator::toString_abi_cxx11_(Locator *this)

{
  string *in_RDI;
  string *returned;
  allocator local_12;
  undefined1 local_11;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"",&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  std::__cxx11::string::operator[]((ulong)m_lon_array1_abi_cxx11_);
  std::__cxx11::string::append((ulong)in_RDI,'\x01');
  std::__cxx11::string::operator[]((ulong)m_lat_array1_abi_cxx11_);
  std::__cxx11::string::append((ulong)in_RDI,'\x01');
  std::__cxx11::string::operator[]((ulong)m_lon_array2_abi_cxx11_);
  std::__cxx11::string::append((ulong)in_RDI,'\x01');
  std::__cxx11::string::operator[]((ulong)m_lat_array2_abi_cxx11_);
  std::__cxx11::string::append((ulong)in_RDI,'\x01');
  std::__cxx11::string::operator[]((ulong)m_lon_array3_abi_cxx11_);
  std::__cxx11::string::append((ulong)in_RDI,'\x01');
  std::__cxx11::string::operator[]((ulong)m_lat_array3_abi_cxx11_);
  std::__cxx11::string::append((ulong)in_RDI,'\x01');
  return in_RDI;
}

Assistant:

std::string Locator::toString() const
{
  std::string returned = "";

  returned.append(1,m_lon_array1[m_lon_index1]);
  returned.append(1,m_lat_array1[m_lat_index1]);
  returned.append(1,m_lon_array2[m_lon_index2]);
  returned.append(1,m_lat_array2[m_lat_index2]);
  returned.append(1,m_lon_array3[m_lon_index3]);
  returned.append(1,m_lat_array3[m_lat_index3]);

  return returned;
}